

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O3

void RGB565ToUVRow_C(uint8_t *src_rgb565,int src_stride_rgb565,uint8_t *dst_u,uint8_t *dst_v,
                    int width)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [13];
  undefined3 uVar18;
  undefined5 uVar19;
  undefined1 auVar20 [12];
  undefined1 auVar21 [14];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  uint uVar26;
  int iVar27;
  uint uVar28;
  uint uVar29;
  long lVar30;
  byte *pbVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  byte bVar34;
  undefined1 uVar37;
  undefined1 uVar38;
  undefined1 uVar39;
  undefined1 uVar40;
  undefined1 uVar41;
  undefined1 uVar42;
  undefined1 uVar43;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar44 [16];
  
  auVar25 = _DAT_004c80f0;
  auVar24 = _DAT_004c80e0;
  auVar23 = _DAT_004c80d0;
  auVar22 = _DAT_004c80a0;
  lVar30 = (long)src_stride_rgb565;
  if (width < 2) {
    pbVar31 = src_rgb565 + lVar30;
  }
  else {
    iVar27 = 0;
    do {
      bVar34 = *src_rgb565;
      bVar1 = src_rgb565[1];
      bVar2 = src_rgb565[2];
      bVar3 = src_rgb565[lVar30];
      bVar4 = src_rgb565[lVar30 + 2];
      bVar5 = src_rgb565[3];
      bVar6 = src_rgb565[lVar30 + 1];
      bVar7 = src_rgb565[lVar30 + 3];
      uVar28 = ((uint)(byte)(bVar3 >> 2 & 7 | bVar3 * '\b') +
                (uint)(byte)(bVar34 >> 2 & 7 | bVar34 * '\b') + 1 >> 1 & 0xff) +
               ((uint)(byte)(bVar4 >> 2 & 7 | bVar4 * '\b') +
                (uint)(byte)(bVar2 >> 2 & 7 | bVar2 * '\b') + 1 >> 1 & 0xff) + 1 >> 1;
      auVar32 = psllw(ZEXT216(CONCAT11(bVar5,bVar1)),3);
      auVar33 = auVar32 & auVar24;
      auVar35 = psllw(ZEXT216(CONCAT11(bVar7,bVar6)),3);
      auVar36 = auVar35 & auVar24;
      auVar44 = psllw(~auVar23 & ZEXT216((ushort)(CONCAT11(bVar2,bVar34) >> 5)) | auVar32 & auVar23,
                      2);
      auVar32._0_2_ = auVar33._0_2_ >> 4;
      auVar32._2_2_ = auVar33._2_2_ >> 4;
      auVar32._4_2_ = auVar33._4_2_ >> 4;
      auVar32._6_2_ = auVar33._6_2_ >> 4;
      auVar32._8_2_ = auVar33._8_2_ >> 4;
      auVar32._10_2_ = auVar33._10_2_ >> 4;
      auVar32._12_2_ = auVar33._12_2_ >> 4;
      auVar32._14_2_ = auVar33._14_2_ >> 4;
      auVar32 = auVar32 & auVar22 | auVar44 & auVar25;
      auVar35 = psllw(~auVar23 & ZEXT216((ushort)(CONCAT11(bVar4,bVar3) >> 5)) | auVar35 & auVar23,2
                     );
      auVar33._0_2_ = auVar36._0_2_ >> 4;
      auVar33._2_2_ = auVar36._2_2_ >> 4;
      auVar33._4_2_ = auVar36._4_2_ >> 4;
      auVar33._6_2_ = auVar36._6_2_ >> 4;
      auVar33._8_2_ = auVar36._8_2_ >> 4;
      auVar33._10_2_ = auVar36._10_2_ >> 4;
      auVar33._12_2_ = auVar36._12_2_ >> 4;
      auVar33._14_2_ = auVar36._14_2_ >> 4;
      auVar33 = auVar33 & auVar22 | auVar35 & auVar25;
      bVar34 = pavgb(auVar33[0],auVar32[0]);
      uVar37 = pavgb(auVar33[1],auVar32[1]);
      pavgb(auVar33[2],auVar32[2]);
      pavgb(auVar33[3],auVar32[3]);
      uVar38 = pavgb(auVar33[4],auVar32[4]);
      uVar39 = pavgb(auVar33[5],auVar32[5]);
      uVar40 = pavgb(auVar33[6],auVar32[6]);
      uVar41 = pavgb(auVar33[7],auVar32[7]);
      uVar42 = pavgb(auVar33[8],auVar32[8]);
      uVar43 = pavgb(auVar33[9],auVar32[9]);
      uVar18 = CONCAT12(uVar43,CONCAT11(uVar42,uVar41));
      uVar43 = pavgb(auVar33[10],auVar32[10]);
      uVar26 = CONCAT13(uVar43,uVar18);
      uVar43 = pavgb(auVar33[0xb],auVar32[0xb]);
      uVar19 = CONCAT14(uVar43,uVar26);
      uVar43 = pavgb(auVar33[0xc],auVar32[0xc]);
      auVar21[5] = uVar43;
      auVar21._0_5_ = uVar19;
      pavgb(auVar33[0xd],auVar32[0xd]);
      pavgb(auVar33[0xe],auVar32[0xe]);
      pavgb(auVar33[0xf],auVar32[0xf]);
      auVar21._6_8_ = 0;
      auVar8[0xe] = uVar41;
      auVar8._0_14_ = auVar21 << 0x38;
      auVar20._4_8_ = 0;
      auVar20._0_4_ = uVar26;
      auVar9._12_3_ = (int3)(CONCAT26(auVar8._13_2_,CONCAT15(uVar40,uVar19)) >> 0x28);
      auVar9._0_12_ = auVar20 << 0x38;
      auVar10._10_5_ = (int5)(CONCAT44(auVar9._11_4_,CONCAT13(uVar39,uVar18)) >> 0x18);
      auVar10._0_10_ = (unkuint10)CONCAT11(uVar42,uVar41) << 0x38;
      auVar12._7_8_ = 0;
      auVar12._0_7_ = (uint7)(CONCAT62(auVar10._9_6_,CONCAT11(uVar38,uVar41)) >> 8);
      auVar13._8_7_ = 0;
      auVar13._0_8_ = SUB158(auVar12 << 0x40,7);
      auVar14._9_6_ = 0;
      auVar14._0_9_ = SUB159(auVar13 << 0x38,6);
      auVar15._10_5_ = 0;
      auVar15._0_10_ = SUB1510(auVar14 << 0x30,5);
      auVar16._11_4_ = 0;
      auVar16._0_11_ = SUB1511(auVar15 << 0x28,4);
      auVar17._1_12_ = SUB1512(auVar16 << 0x20,3);
      auVar17[0] = uVar37;
      auVar11[1] = 0;
      auVar11[0] = bVar34;
      auVar11._2_13_ = auVar17;
      uVar29 = (auVar11._0_4_ + (uint)auVar17._0_2_ + 1 & 0xffff) >> 1;
      uVar26 = ((uint)(byte)(bVar6 & 0xf8 | bVar6 >> 5) + (uint)(byte)(bVar1 & 0xf8 | bVar1 >> 5) +
                1 >> 1 & 0xff) +
               ((uint)(byte)(bVar7 & 0xf8 | bVar7 >> 5) + (uint)(byte)(bVar5 & 0xf8 | bVar5 >> 5) +
                1 >> 1 & 0xff) + 1 >> 1;
      *dst_u = (uint8_t)((uVar26 * 0xffda ^ 0x8000) + uVar28 * 0x70 + uVar29 * 0xffb6 >> 8);
      *dst_v = (uint8_t)(uVar28 * 0xffee + uVar26 * 0x70 + 0x8000 + uVar29 * 0xffa2 >> 8);
      src_rgb565 = src_rgb565 + 4;
      dst_u = dst_u + 1;
      dst_v = dst_v + 1;
      iVar27 = iVar27 + 2;
    } while (iVar27 < width + -1);
    pbVar31 = src_rgb565 + lVar30;
  }
  if ((width & 1U) != 0) {
    bVar34 = *src_rgb565;
    bVar1 = src_rgb565[1];
    bVar2 = *pbVar31;
    bVar3 = pbVar31[1];
    uVar29 = (uint)(byte)(bVar2 >> 2 & 7 | bVar2 * '\b') +
             (uint)(byte)(bVar34 >> 2 & 7 | bVar34 * '\b') + 1 >> 1 & 0xff;
    uVar26 = (uint)(byte)(bVar3 >> 1 & 3 | bVar2 >> 3 & 0x1c | bVar3 << 5) +
             (uint)(byte)(bVar1 >> 1 & 3 | bVar34 >> 3 & 0x1c | bVar1 << 5) + 1 >> 1 & 0xff;
    uVar28 = (uint)(byte)(bVar1 & 0xf8 | bVar1 >> 5) + (uint)(byte)(bVar3 & 0xf8 | bVar3 >> 5) + 1
             >> 1 & 0xff;
    *dst_u = (uint8_t)((uVar28 * 0xffda ^ 0x8000) + uVar29 * 0x70 + uVar26 * 0xffb6 >> 8);
    *dst_v = (uint8_t)(uVar29 * 0xffee + uVar28 * 0x70 + uVar26 * 0xffa2 + 0x8000 >> 8);
  }
  return;
}

Assistant:

void RGB565ToUVRow_C(const uint8_t* src_rgb565,
                     int src_stride_rgb565,
                     uint8_t* dst_u,
                     uint8_t* dst_v,
                     int width) {
  const uint8_t* next_rgb565 = src_rgb565 + src_stride_rgb565;
  int x;
  for (x = 0; x < width - 1; x += 2) {
    uint8_t b0 = src_rgb565[0] & 0x1f;
    uint8_t g0 = (src_rgb565[0] >> 5) | ((src_rgb565[1] & 0x07) << 3);
    uint8_t r0 = src_rgb565[1] >> 3;
    uint8_t b1 = src_rgb565[2] & 0x1f;
    uint8_t g1 = (src_rgb565[2] >> 5) | ((src_rgb565[3] & 0x07) << 3);
    uint8_t r1 = src_rgb565[3] >> 3;
    uint8_t b2 = next_rgb565[0] & 0x1f;
    uint8_t g2 = (next_rgb565[0] >> 5) | ((next_rgb565[1] & 0x07) << 3);
    uint8_t r2 = next_rgb565[1] >> 3;
    uint8_t b3 = next_rgb565[2] & 0x1f;
    uint8_t g3 = (next_rgb565[2] >> 5) | ((next_rgb565[3] & 0x07) << 3);
    uint8_t r3 = next_rgb565[3] >> 3;

    b0 = (b0 << 3) | (b0 >> 2);
    g0 = (g0 << 2) | (g0 >> 4);
    r0 = (r0 << 3) | (r0 >> 2);
    b1 = (b1 << 3) | (b1 >> 2);
    g1 = (g1 << 2) | (g1 >> 4);
    r1 = (r1 << 3) | (r1 >> 2);
    b2 = (b2 << 3) | (b2 >> 2);
    g2 = (g2 << 2) | (g2 >> 4);
    r2 = (r2 << 3) | (r2 >> 2);
    b3 = (b3 << 3) | (b3 >> 2);
    g3 = (g3 << 2) | (g3 >> 4);
    r3 = (r3 << 3) | (r3 >> 2);

#if defined(LIBYUV_ARGBTOUV_PAVGB)
    uint8_t ab = AVGB(AVGB(b0, b2), AVGB(b1, b3));
    uint8_t ag = AVGB(AVGB(g0, g2), AVGB(g1, g3));
    uint8_t ar = AVGB(AVGB(r0, r2), AVGB(r1, r3));
    dst_u[0] = RGBToU(ar, ag, ab);
    dst_v[0] = RGBToV(ar, ag, ab);
#else
    uint16_t b = (b0 + b1 + b2 + b3 + 1) >> 1;
    uint16_t g = (g0 + g1 + g2 + g3 + 1) >> 1;
    uint16_t r = (r0 + r1 + r2 + r3 + 1) >> 1;
    dst_u[0] = RGB2xToU(r, g, b);
    dst_v[0] = RGB2xToV(r, g, b);
#endif

    src_rgb565 += 4;
    next_rgb565 += 4;
    dst_u += 1;
    dst_v += 1;
  }
  if (width & 1) {
    uint8_t b0 = src_rgb565[0] & 0x1f;
    uint8_t g0 = (src_rgb565[0] >> 5) | ((src_rgb565[1] & 0x07) << 3);
    uint8_t r0 = src_rgb565[1] >> 3;
    uint8_t b2 = next_rgb565[0] & 0x1f;
    uint8_t g2 = (next_rgb565[0] >> 5) | ((next_rgb565[1] & 0x07) << 3);
    uint8_t r2 = next_rgb565[1] >> 3;

    b0 = (b0 << 3) | (b0 >> 2);
    g0 = (g0 << 2) | (g0 >> 4);
    r0 = (r0 << 3) | (r0 >> 2);
    b2 = (b2 << 3) | (b2 >> 2);
    g2 = (g2 << 2) | (g2 >> 4);
    r2 = (r2 << 3) | (r2 >> 2);

#if defined(LIBYUV_ARGBTOUV_PAVGB)
    uint8_t ab = AVGB(b0, b2);
    uint8_t ag = AVGB(g0, g2);
    uint8_t ar = AVGB(r0, r2);
    dst_u[0] = RGBToU(ar, ag, ab);
    dst_v[0] = RGBToV(ar, ag, ab);
#else
    uint16_t b = b0 + b2;
    uint16_t g = g0 + g2;
    uint16_t r = r0 + r2;
    dst_u[0] = RGB2xToU(r, g, b);
    dst_v[0] = RGB2xToV(r, g, b);
#endif
  }
}